

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

char ** file2array(char *fname)

{
  FILE *__stream;
  char *pcVar1;
  FILE *fp;
  size_t lines_mem;
  size_t lines_num;
  char *line;
  char **content;
  char *fname_local;
  
  line = (char *)0x0;
  __stream = fopen(fname,"r");
  if (__stream == (FILE *)0x0) {
    vrna_message_warning("read_parameter_file():Can\'t open file %s\n",fname);
  }
  else {
    lines_mem = 0;
    fp = (FILE *)0x8000;
    line = (char *)vrna_alloc(0x40000);
    while( true ) {
      pcVar1 = vrna_read_line((FILE *)__stream);
      if (pcVar1 == (char *)0x0) break;
      if ((FILE *)lines_mem == fp) {
        fp = (FILE *)&fp[0x97]._codecvt;
        line = (char *)vrna_realloc(line,(int)fp * 8);
      }
      *(char **)(line + lines_mem * 8) = pcVar1;
      lines_mem = lines_mem + 1;
    }
    line = (char *)vrna_realloc(line,((int)lines_mem + 1) * 8);
    pcVar1 = line + lines_mem * 8;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    fclose(__stream);
  }
  return (char **)line;
}

Assistant:

PRIVATE char **
file2array(const char fname[])
{
  char    **content, *line;
  size_t  lines_num, lines_mem;
  FILE    *fp;

  content = NULL;

  if ((fp = fopen(fname, "r"))) {
    lines_num = 0;
    lines_mem = 32768;

    content = (char **)vrna_alloc(sizeof(char *) * lines_mem);

    /* read file line-by-line */
    while ((line = vrna_read_line(fp))) {
      if (lines_num == lines_mem) {
        lines_mem += 32768;
        content   = (char **)vrna_realloc(content, sizeof(char *) * lines_mem);
      }

      content[lines_num] = line;
      lines_num++;
    }

    /* reallocate to actual requirements */
    content             = (char **)vrna_realloc(content, sizeof(char *) * (lines_num + 1));
    content[lines_num]  = NULL;

    fclose(fp);
  } else {
    vrna_message_warning("read_parameter_file():"
                         "Can't open file %s\n",
                         fname);
  }

  return content;
}